

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::ConstBool<unsigned_long_long>(void)

{
  bool bVar1;
  int *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffe4;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_18;
  undefined4 local_c;
  SafeInt local_8 [8];
  
  local_c = 2;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  ::SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffd8);
  bVar1 = ::SafeInt::operator_cast_to_bool(local_8);
  uVar2 = in_stack_ffffffffffffffe0 & 0xffffff;
  if (bVar1) {
    SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
    ::SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)(ulong)uVar2,in_stack_ffffffffffffffd8);
    bVar1 = SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            ::operator!(&local_18);
    uVar2 = (uint)bVar1 << 0x18;
  }
  return SUB41(uVar2 >> 0x18,0);
}

Assistant:

SAFEINT_CONSTEXPR11 bool ConstBool()
	{
		return (bool)SafeInt<T>(2) && !SafeInt<T>(0);
	}